

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

SmallBuffer * helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,string_view val)

{
  value_t vVar1;
  json_value jVar2;
  bool bVar3;
  string *val_00;
  reference pvVar4;
  NamedPoint *val_01;
  double dVar5;
  string_view val_02;
  string_view val_03;
  string_view val_04;
  string_view in_stack_ffffffffffffff68;
  NamedPoint local_88;
  json json;
  string_view val_local;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  data local_30;
  
  val_local._M_str = val._M_str;
  val_02._M_str = (helics *)val._M_len;
  val_local._M_len = (size_t)val_02._M_str;
  if (val_02._M_str == (helics *)0x0) {
    emptyBlock(__return_storage_ptr__,type,HELICS_ANY);
    return __return_storage_ptr__;
  }
  switch(type) {
  case HELICS_DOUBLE:
    local_88.name._M_dataplus._M_p = (pointer)getDoubleFromString(val);
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&local_88);
    break;
  case HELICS_INT:
    dVar5 = getDoubleFromString(val);
    local_88.name._M_dataplus._M_p = (pointer)(long)dVar5;
    goto LAB_0023bc48;
  case HELICS_COMPLEX:
    val_02._M_len = (size_t)val_local._M_str;
    helicsGetComplex(val_02._M_str,val_02);
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&local_88);
    break;
  case HELICS_VECTOR:
    val_04._M_str = (char *)&switchD_0023ba7d::switchdataD_00395638;
    val_04._M_len = (size_t)val_local._M_str;
    helicsGetVector((vector<double,_std::allocator<double>_> *)&local_88,val_02._M_str,val_04);
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)&local_88);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_88);
    break;
  case HELICS_COMPLEX_VECTOR:
    val_03._M_str = (char *)&switchD_0023ba7d::switchdataD_00395638;
    val_03._M_len = (size_t)val_local._M_str;
    helicsGetComplexVector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_88,
               val_02._M_str,val_03);
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert(__return_storage_ptr__,
            (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_88);
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               &local_88);
    break;
  case HELICS_NAMED_POINT:
    dVar5 = nan("0");
    NamedPoint::NamedPoint(&local_88,val,dVar5);
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    break;
  case HELICS_BOOL:
    bVar3 = helicsBoolValue(in_stack_ffffffffffffff68);
    local_88.name._M_string_length = 0x3a9792;
    if (bVar3) {
      local_88.name._M_string_length = 0x3b0ea2;
    }
    local_88.name._M_string_length = local_88.name._M_string_length + 1;
    val_01 = &local_88;
    local_88.name._M_dataplus._M_p = (pointer)0x1;
    goto LAB_0023bcc6;
  case HELICS_TIME:
    dVar5 = getDoubleFromString(val);
    local_88.name._M_dataplus._M_p = (pointer)count_time<9,_long>::convert(dVar5);
LAB_0023bc48:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&local_88);
    break;
  default:
    if (type == HELICS_JSON) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&json,(nullptr_t)0x0);
      val_00 = typeNameStringRef_abi_cxx11_(HELICS_STRING);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_00);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"type");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_30.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_30.m_value;
      local_30.m_type = vVar1;
      local_30.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_30);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_88,(basic_string_view<char,_std::char_traits<char>_> *)&val_local,
                 (allocator<char> *)&stack0xffffffffffffff77);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,&local_88.name);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"value");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_40._M_local_buf[0];
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = (json_value)local_40._8_8_;
      local_40._M_local_buf[0] = vVar1;
      local_40._8_8_ = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_40);
      std::__cxx11::string::~string((string *)&local_88);
      fileops::generateJsonString(&local_88.name,&json,true);
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>(__return_storage_ptr__,&local_88.name);
      std::__cxx11::string::~string((string *)&local_88);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&json.m_data);
      return __return_storage_ptr__;
    }
    val_01 = (NamedPoint *)&val_local;
LAB_0023bcc6:
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)val_01);
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, std::string_view val)
{
    if (val.empty()) {
        return emptyBlock(type);
    }

    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(getDoubleFromString(val));
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(getDoubleFromString(val)));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(
                Time(getDoubleFromString(val)).getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(helicsGetComplex(val));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((helicsBoolValue(val)) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default:
            return ValueConverter<std::string_view>::convert(val);
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(NamedPoint{val, std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR:
            return ValueConverter<std::vector<std::complex<double>>>::convert(
                helicsGetComplexVector(val));
        case DataType::HELICS_VECTOR:
            return ValueConverter<std::vector<double>>::convert(helicsGetVector(val));
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_STRING);
            json["value"] = std::string(val);
            return fileops::generateJsonString(json);
        }
    }
}